

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

pcp_flow_event_e fhndl_received_success(pcp_flow_t *f,pcp_recv_msg_t *msg)

{
  undefined1 local_28 [8];
  timeval ctv;
  pcp_recv_msg_t *msg_local;
  pcp_flow_t *f_local;
  
  if (0x7fffffffffffffff - msg->received_time < (long)(ulong)msg->recv_lifetime) {
    f->recv_lifetime = 0x7fffffffffffffff;
  }
  else {
    f->recv_lifetime = msg->received_time + (ulong)msg->recv_lifetime;
  }
  if (((f->kd).operation == '\x01') || ((f->kd).operation == '\x02')) {
    *(undefined8 *)&f->field_5 = *(undefined8 *)&(msg->assigned_ext_ip).__in6_u;
    *(undefined8 *)((long)&f->field_5 + 8) =
         *(undefined8 *)((long)&(msg->assigned_ext_ip).__in6_u + 8);
    (f->field_5).map_peer.ext_port = msg->assigned_ext_port;
  }
  else if ((f->kd).operation == '\x03') {
    (f->field_5).sadscp.learned_dscp = msg->recv_dscp;
  }
  f->recv_result = msg->recv_result;
  ctv.tv_usec = (__suseconds_t)msg;
  gettimeofday((timeval *)local_28,(__timezone_ptr_t)0x0);
  if (*(int *)(ctv.tv_usec + 0x70) == 0) {
    (f->timeout).tv_sec = 0;
    (f->timeout).tv_usec = 0;
  }
  else {
    (f->timeout).tv_sec = (__time_t)local_28;
    (f->timeout).tv_usec = ctv.tv_sec;
    (f->timeout).tv_sec = (f->recv_lifetime - (long)local_28 >> 1) + (f->timeout).tv_sec;
  }
  return fev_none;
}

Assistant:

static pcp_flow_event_e fhndl_received_success(pcp_flow_t *f,
                                               pcp_recv_msg_t *msg) {
    struct timeval ctv;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);
    // avoid integer overflow
    if (msg->recv_lifetime > (time_t)LONG_MAX - msg->received_time) {
        f->recv_lifetime = LONG_MAX;
    } else {
        f->recv_lifetime = msg->received_time + msg->recv_lifetime;
    }
    if ((f->kd.operation == PCP_OPCODE_MAP) ||
        (f->kd.operation == PCP_OPCODE_PEER)) {
        f->map_peer.ext_ip = msg->assigned_ext_ip;
        f->map_peer.ext_port = msg->assigned_ext_port;
#ifdef PCP_SADSCP
    } else if (f->kd.operation == PCP_OPCODE_SADSCP) {
        f->sadscp.learned_dscp = msg->recv_dscp;
#endif
    }
    f->recv_result = msg->recv_result;

    gettimeofday(&ctv, NULL);

    if (msg->recv_lifetime == 0) {
        f->timeout.tv_sec = 0;
        f->timeout.tv_usec = 0;
    } else {
        f->timeout = ctv;
        f->timeout.tv_sec += (long int)((f->recv_lifetime - ctv.tv_sec) >> 1);
    }

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return fev_none;
}